

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::handle_inconsistent_hashes(torrent *this,piece_index_t piece)

{
  undefined1 *puVar1;
  file_index_t error_file;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> file_slices;
  _Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> local_40;
  error_code local_28;
  
  file_storage::map_block
            ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)&local_40,
             &((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files,piece,0,0);
  if (local_40._M_impl.super__Vector_impl_data._M_start ==
      local_40._M_impl.super__Vector_impl_data._M_finish) {
    local_40._M_impl.super__Vector_impl_data._M_start = (pointer)&torrent_status::error_file_none;
  }
  error_file.m_val = ((local_40._M_impl.super__Vector_impl_data._M_start)->file_index).m_val;
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            (&local_28,torrent_inconsistent_hashes,(type *)0x0);
  set_error(this,&local_28,error_file);
  ::std::
  __uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
  ::reset((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           *)&this->super_torrent_hot_members,(pointer)0x0);
  ::std::
  __uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  ::reset((__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
           *)&(this->super_torrent_hot_members).m_hash_picker,(pointer)0x0);
  aux::file_progress::clear(&this->m_file_progress);
  puVar1 = &(this->super_torrent_hot_members).field_0x4b;
  *puVar1 = *puVar1 & 0xbf;
  update_gauge(this);
  pause(this);
  ::std::_Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::
  ~_Vector_base(&local_40);
  return;
}

Assistant:

void torrent::handle_inconsistent_hashes(piece_index_t const piece)
	{
		auto const file_slices = torrent_file().map_block(piece, 0, 0);
		file_index_t const file = file_slices.empty() ? torrent_status::error_file_none : file_slices[0].file_index;
		set_error(errors::torrent_inconsistent_hashes, file);
		// if this is a hybrid torrent, we may have marked some more pieces
		// as "have" but not yet validated them against the v2 hashes. At
		// this point, just assume we have no pieces
		m_picker.reset();
		m_hash_picker.reset();
		m_file_progress.clear();
		m_have_all = false;
		update_gauge();
		pause();
	}